

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateSetLogFile(HelicsFederate fed,char *logFile,HelicsError *err)

{
  element_type *peVar1;
  Federate *pFVar2;
  size_t sVar3;
  long *local_40;
  undefined8 local_38;
  long local_30 [2];
  
  pFVar2 = getFed(fed,err);
  if (pFVar2 != (Federate *)0x0) {
    peVar1 = (pFVar2->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -10;
        err->message = "Federate core is not connected";
      }
    }
    else {
      local_40 = local_30;
      if (logFile == (char *)0x0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                   gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                   gHelicsEmptyStr_abi_cxx11_._M_string_length);
      }
      else {
        sVar3 = strlen(logFile);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,logFile,logFile + sVar3)
        ;
      }
      (*peVar1->_vptr_Core[0x59])(peVar1,local_38,local_40);
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateSetLogFile(HelicsFederate fed, const char* logFile, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    const auto& corePtr = fedObj->getCorePointer();

    try {
        if (corePtr) {
            corePtr->setLogFile(AS_STRING(logFile));
            // LCOV_EXCL_START
        } else {  // this can theoretically happen but it would be pretty odd
            assignError(err, HELICS_ERROR_INVALID_FUNCTION_CALL, invalidFederateCore);
            return;
            // LCOV_EXCL_STOP
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}